

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  long lVar1;
  pid_t pVar2;
  gid_t gVar3;
  uid_t uVar4;
  dev_t dVar5;
  u64 uVar6;
  sqlite3_vfs *psVar7;
  UnixUnusedFd **ppUVar8;
  ulong uVar9;
  unixInodeInfo *puVar10;
  __pid_t _Var11;
  int iVar12;
  sqlite3_io_methods *psVar13;
  size_t sVar14;
  char *pcVar15;
  int *piVar16;
  char *zFile;
  int *piVar17;
  unixInodeInfo *puVar18;
  sqlite3_mutex *psVar19;
  uint uVar20;
  mode_t m;
  UnixUnusedFd **ppUVar21;
  int iVar22;
  uint uVar23;
  sqlite3_io_methods *psVar24;
  ulong uVar25;
  unixInodeInfo **ppuVar26;
  uint uVar27;
  uint uVar28;
  long in_FS_OFFSET;
  undefined1 auVar29 [16];
  uint local_4b0;
  gid_t gid;
  uid_t uid;
  unixFile *local_4a0;
  undefined4 local_498;
  uint local_494;
  undefined4 local_490;
  uint local_48c;
  mode_t openMode;
  char cStack_484;
  char cStack_483;
  char cStack_482;
  char cStack_481;
  undefined8 uStack_480;
  ulong local_470;
  char *local_468;
  sqlite3_vfs *local_460;
  char zTmpname [514];
  char cStack_249;
  char zDb [513];
  
  pVar2 = randomnessPid;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar27 = flags & 0xfff00;
  if (((flags & 4U) == 0) ||
     (((local_490 = 1, uVar27 != 0x800 && (uVar27 != 0x4000)) && (uVar27 != 0x80000)))) {
    local_490 = 0;
  }
  local_4a0 = (unixFile *)pOutFlags;
  _Var11 = getpid();
  if (pVar2 != _Var11) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pFile[0xe].pMethods = (sqlite3_io_methods *)0x0;
  pcVar15 = zPath;
  local_494 = uVar27;
  if (uVar27 == 0x100) {
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    if ((inodeList == (unixInodeInfo *)0x0) ||
       (iVar12 = (*aSyscall[4].pCurrent)(zPath,zTmpname), iVar12 != 0)) {
      psVar13 = (sqlite3_io_methods *)0x0;
    }
    else {
      psVar13 = (sqlite3_io_methods *)0x0;
      ppuVar26 = &inodeList;
      while (puVar18 = *ppuVar26, puVar18 != (unixInodeInfo *)0x0) {
        if (((puVar18->fileId).dev == zTmpname._0_8_) && ((puVar18->fileId).ino == zTmpname._8_8_))
        {
          if (puVar18->pLockMutex != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexEnter)(puVar18->pLockMutex);
          }
          ppUVar8 = &puVar18->pUnused;
          goto LAB_00116a12;
        }
        ppuVar26 = &puVar18->pNext;
      }
    }
    goto LAB_001164c9;
  }
  uVar27 = 0xffffffff;
  if (zPath == (char *)0x0) {
    pcVar15 = zTmpname;
    uVar27 = 0xffffffff;
    iVar12 = unixGetTempname(pVfs->mxPathname,pcVar15);
    if (iVar12 != 0) goto LAB_00116b5f;
  }
  goto LAB_0011656b;
  while (ppUVar8 = (UnixUnusedFd **)&psVar13->xClose, *(uint *)&psVar13->field_0x4 != (flags & 3U))
  {
LAB_00116a12:
    ppUVar21 = ppUVar8;
    psVar13 = (sqlite3_io_methods *)*ppUVar21;
    if (psVar13 == (sqlite3_io_methods *)0x0) goto LAB_00116a2d;
  }
  *ppUVar21 = (UnixUnusedFd *)psVar13->xClose;
LAB_00116a2d:
  if (puVar18->pLockMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(puVar18->pLockMutex);
  }
LAB_001164c9:
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
  }
  if (psVar13 == (sqlite3_io_methods *)0x0) {
    psVar13 = (sqlite3_io_methods *)sqlite3_malloc64(0x10);
    if (psVar13 == (sqlite3_io_methods *)0x0) {
      iVar12 = 7;
      goto LAB_00116b5f;
    }
    uVar27 = 0xffffffff;
  }
  else {
    uVar27 = psVar13->iVersion;
  }
  pFile[6].pMethods = psVar13;
LAB_0011656b:
  uVar23 = flags & 8;
  local_4b0 = flags & 1;
  local_460 = pVfs;
  if ((int)uVar27 < 0) {
    _openMode = _openMode & 0xffffffff00000000;
    uid = 0;
    gid = 0;
    uVar28 = flags & 0x80800;
    local_4b0 = flags & 1;
    local_468 = zPath;
    if (uVar28 == 0) {
      m = 0x180;
      if ((uVar23 == 0) && (m = 0, (flags & 0x40U) != 0)) {
        zFile = sqlite3_uri_parameter(pcVar15,"modeof");
        m = 0;
        if (zFile != (char *)0x0) goto LAB_00116854;
      }
    }
    else {
      uVar27 = sqlite3Strlen30(pcVar15);
      iVar12 = 0;
      uVar9 = (ulong)uVar27;
      do {
        uVar25 = uVar9;
        if (((long)uVar25 < 2) || (pcVar15[uVar25 - 1] == '.')) goto LAB_0011685c;
        uVar9 = uVar25 - 1;
      } while (pcVar15[uVar25 - 1] != '-');
      zFile = zDb;
      memcpy(zFile,pcVar15,uVar25 - 1);
      zDb[uVar25 - 1] = '\0';
LAB_00116854:
      iVar12 = getFileMode(zFile,&openMode,&uid,&gid);
LAB_0011685c:
      if (iVar12 != 0) goto LAB_00116b5f;
      m = openMode;
    }
    local_48c = (flags & 4U) * 0x10 + (flags & 0x10U) * 8 + (flags & 2U) + 0x20000;
    uVar27 = robust_open(pcVar15,local_48c,m);
    uVar20 = local_48c;
    if (-1 < (int)uVar27) {
LAB_001168a9:
      zPath = local_468;
      uVar4 = uid;
      gVar3 = gid;
      if ((uVar28 != 0 && m != 0) && (iVar12 = (*aSyscall[0x15].pCurrent)(), iVar12 == 0)) {
        (*aSyscall[0x14].pCurrent)((ulong)uVar27,uVar4,(ulong)gVar3);
      }
      goto LAB_00116589;
    }
    local_470 = (ulong)(flags & 2U);
    piVar17 = __errno_location();
    piVar16 = piVar17;
    if (((char)local_490 == '\0') || (*piVar17 != 0xd)) {
LAB_0011695f:
      iVar12 = 0;
      local_498 = (undefined4)CONCAT71((int7)((ulong)piVar16 >> 8),1);
      if ((((int)local_470 != 0) && (*piVar17 != 0x15)) &&
         (uVar27 = robust_open(pcVar15,uVar20 & 0x20080,m), -1 < (int)uVar27)) {
        local_4b0 = 1;
        flags = (flags & 0xfffffff8U) + 1;
        goto LAB_001168a9;
      }
    }
    else {
      local_498 = 0;
      piVar16 = (int *)(*aSyscall[2].pCurrent)(pcVar15,0);
      if ((int)piVar16 == 0) goto LAB_0011695f;
      iVar12 = 0x608;
    }
    iVar22 = sqlite3CantopenError(0xa2f2);
    unixLogErrorAtLine(iVar22,"open",pcVar15,0xa2f2);
    if ((char)local_498 != '\0') {
      iVar12 = iVar22;
    }
LAB_00116b56:
    sqlite3_free(((unixFile *)pFile)->pPreallocatedUnused);
  }
  else {
LAB_00116589:
    uVar28 = local_494;
    if (local_4a0 != (unixFile *)0x0) {
      *(int *)&local_4a0->pMethod = flags;
    }
    psVar13 = pFile[6].pMethods;
    if (psVar13 != (sqlite3_io_methods *)0x0) {
      psVar13->iVersion = uVar27;
      *(uint *)&psVar13->field_0x4 = flags & 3;
    }
    if (uVar23 != 0) {
      local_4a0 = (unixFile *)pFile;
      (*aSyscall[0x10].pCurrent)();
      pFile = (sqlite3_file *)local_4a0;
    }
    psVar7 = local_460;
    uVar20 = uVar23 * 4 + 2;
    if (local_4b0 == 0) {
      uVar20 = uVar23 * 4;
    }
    uVar23 = uVar20 + 0x80;
    if (uVar28 == 0x100) {
      uVar23 = uVar20;
    }
    uVar28 = uVar23 | 8;
    if ((char)local_490 == '\0') {
      uVar28 = uVar23;
    }
    ((unixFile *)pFile)->h = uVar27;
    ((unixFile *)pFile)->pVfs = local_460;
    ((unixFile *)pFile)->zPath = zPath;
    ((unixFile *)pFile)->ctrlFlags = (ushort)(flags & 0x40U) | (ushort)uVar28;
    ((unixFile *)pFile)->mmapSizeMax = sqlite3Config.szMmap;
    pcVar15 = (char *)0x0;
    if ((flags & 0x40U) != 0 || (uVar28 & 0x40) != 0) {
      pcVar15 = zPath;
    }
    iVar12 = sqlite3_uri_boolean(pcVar15,"psow",1);
    if (iVar12 != 0) {
      *(byte *)&((unixFile *)pFile)->ctrlFlags = (byte)((unixFile *)pFile)->ctrlFlags | 0x10;
    }
    iVar12 = strcmp(psVar7->zName,"unix-excl");
    if (iVar12 == 0) {
      *(byte *)&((unixFile *)pFile)->ctrlFlags = (byte)((unixFile *)pFile)->ctrlFlags | 1;
    }
    if ((char)uVar28 < '\0') {
      psVar13 = &nolockIoMethods;
LAB_001166e2:
      ((unixFile *)pFile)->lastErrno = 0;
    }
    else {
      psVar13 = (sqlite3_io_methods *)(**psVar7->pAppData)(zPath,pFile);
      psVar24 = &posixIoMethods;
      if (psVar13 == &posixIoMethods) {
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
        }
        iVar12 = (*aSyscall[5].pCurrent)((ulong)(uint)((unixFile *)pFile)->h,zDb);
        if (iVar12 == 0) {
          openMode._0_1_ = zDb[0];
          openMode._1_1_ = zDb[1];
          openMode._2_1_ = zDb[2];
          openMode._3_1_ = zDb[3];
          cStack_484 = zDb[4];
          cStack_483 = zDb[5];
          cStack_482 = zDb[6];
          cStack_481 = zDb[7];
          dVar5 = _openMode;
          uStack_480._0_1_ = zDb[8];
          uStack_480._1_1_ = zDb[9];
          uStack_480._2_1_ = zDb[10];
          uStack_480._3_1_ = zDb[0xb];
          uStack_480._4_1_ = zDb[0xc];
          uStack_480._5_1_ = zDb[0xd];
          uStack_480._6_1_ = zDb[0xe];
          uStack_480._7_1_ = zDb[0xf];
          uVar6 = uStack_480;
          ppuVar26 = &inodeList;
          while (puVar18 = *ppuVar26, _openMode = dVar5, uStack_480 = uVar6,
                puVar18 != (unixInodeInfo *)0x0) {
            openMode._0_1_ = (char)zDb._0_8_;
            openMode._1_1_ = SUB81(zDb._0_8_,1);
            openMode._2_1_ = SUB81(zDb._0_8_,2);
            openMode._3_1_ = SUB81(zDb._0_8_,3);
            cStack_484 = SUB81(zDb._0_8_,4);
            cStack_483 = SUB81(zDb._0_8_,5);
            cStack_482 = SUB81(zDb._0_8_,6);
            cStack_481 = SUB81(zDb._0_8_,7);
            uStack_480._0_1_ = (char)zDb._8_8_;
            uStack_480._1_1_ = SUB81(zDb._8_8_,1);
            uStack_480._2_1_ = SUB81(zDb._8_8_,2);
            uStack_480._3_1_ = SUB81(zDb._8_8_,3);
            uStack_480._4_1_ = SUB81(zDb._8_8_,4);
            uStack_480._5_1_ = SUB81(zDb._8_8_,5);
            uStack_480._6_1_ = SUB81(zDb._8_8_,6);
            uStack_480._7_1_ = SUB81(zDb._8_8_,7);
            auVar29[0] = -((char)(puVar18->fileId).dev == (char)openMode);
            auVar29[1] = -(*(char *)((long)&(puVar18->fileId).dev + 1) == openMode._1_1_);
            auVar29[2] = -(*(char *)((long)&(puVar18->fileId).dev + 2) == openMode._2_1_);
            auVar29[3] = -(*(char *)((long)&(puVar18->fileId).dev + 3) == openMode._3_1_);
            auVar29[4] = -(*(char *)((long)&(puVar18->fileId).dev + 4) == cStack_484);
            auVar29[5] = -(*(char *)((long)&(puVar18->fileId).dev + 5) == cStack_483);
            auVar29[6] = -(*(char *)((long)&(puVar18->fileId).dev + 6) == cStack_482);
            auVar29[7] = -(*(char *)((long)&(puVar18->fileId).dev + 7) == cStack_481);
            auVar29[8] = -((char)(puVar18->fileId).ino == (char)uStack_480);
            auVar29[9] = -(*(char *)((long)&(puVar18->fileId).ino + 1) == uStack_480._1_1_);
            auVar29[10] = -(*(char *)((long)&(puVar18->fileId).ino + 2) == uStack_480._2_1_);
            auVar29[0xb] = -(*(char *)((long)&(puVar18->fileId).ino + 3) == uStack_480._3_1_);
            auVar29[0xc] = -(*(char *)((long)&(puVar18->fileId).ino + 4) == uStack_480._4_1_);
            auVar29[0xd] = -(*(char *)((long)&(puVar18->fileId).ino + 5) == uStack_480._5_1_);
            auVar29[0xe] = -(*(char *)((long)&(puVar18->fileId).ino + 6) == uStack_480._6_1_);
            auVar29[0xf] = -(*(char *)((long)&(puVar18->fileId).ino + 7) == uStack_480._7_1_);
            if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar29[0xf] >> 7) << 0xf) == 0xffff) {
              puVar18->nRef = puVar18->nRef + 1;
              puVar10 = inodeList;
              goto LAB_00116b17;
            }
            ppuVar26 = &puVar18->pNext;
          }
          puVar18 = (unixInodeInfo *)sqlite3_malloc64(0x50);
          iVar12 = 7;
          if (puVar18 == (unixInodeInfo *)0x0) goto LAB_001167c7;
          puVar18->pNext = (unixInodeInfo *)0x0;
          puVar18->pPrev = (unixInodeInfo *)0x0;
          puVar18->nRef = 0;
          *(undefined4 *)&puVar18->field_0x34 = 0;
          puVar18->pShmNode = (unixShmNode *)0x0;
          puVar18->eFileLock = '\0';
          puVar18->bProcessLock = '\0';
          *(undefined6 *)&puVar18->field_0x22 = 0;
          puVar18->pUnused = (UnixUnusedFd *)0x0;
          puVar18->pLockMutex = (sqlite3_mutex *)0x0;
          puVar18->nShared = 0;
          puVar18->nLock = 0;
          (puVar18->fileId).dev = _openMode;
          (puVar18->fileId).ino = uStack_480;
          if (sqlite3Config.bCoreMutex != '\0') {
            psVar19 = sqlite3_mutex_alloc(0);
            puVar18->pLockMutex = psVar19;
            if (psVar19 == (sqlite3_mutex *)0x0) {
              sqlite3_free(puVar18);
              goto LAB_001167c7;
            }
          }
          puVar18->nRef = 1;
          puVar18->pNext = inodeList;
          puVar18->pPrev = (unixInodeInfo *)0x0;
          puVar10 = puVar18;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = puVar18;
          }
LAB_00116b17:
          inodeList = puVar10;
          ((unixFile *)pFile)->pInode = puVar18;
          iVar12 = 0;
        }
        else {
          piVar16 = __errno_location();
          ((unixFile *)pFile)->lastErrno = *piVar16;
          iVar12 = 10;
LAB_001167c7:
          robust_close((unixFile *)pFile,uVar27,0xa0e4);
          uVar27 = 0xffffffff;
        }
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
      }
      else {
        psVar24 = &dotlockIoMethods;
        if (psVar13 != &dotlockIoMethods) goto LAB_001166e2;
        sVar14 = strlen(zPath);
        iVar22 = (int)sVar14 + 6;
        pcVar15 = (char *)sqlite3_malloc64((long)iVar22);
        if (pcVar15 == (char *)0x0) {
          iVar12 = 7;
        }
        else {
          iVar12 = 0;
          sqlite3_snprintf(iVar22,pcVar15,"%s.lock",zPath);
        }
        ((unixFile *)pFile)->lockingContext = pcVar15;
      }
      ((unixFile *)pFile)->lastErrno = 0;
      psVar13 = psVar24;
      if (iVar12 != 0) {
        if (-1 < (int)uVar27) {
          robust_close((unixFile *)pFile,uVar27,0xa139);
        }
        goto LAB_00116b56;
      }
    }
    ((unixFile *)pFile)->pMethod = psVar13;
    verifyDbFile((unixFile *)pFile);
    iVar12 = 0;
  }
LAB_00116b5f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0x0FFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a super- or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_SUPER_JOURNAL
     || eType==SQLITE_OPEN_MAIN_JOURNAL
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true:
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and super-journal are never
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_SUPER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_SUPER_JOURNAL
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

#ifdef SQLITE_ASSERT_NO_FILES
  /* Applications that never read or write a persistent disk files */
  assert( zName==0 );
#endif

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY|O_NOFOLLOW);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        fd = robust_open(zName, openFlags, openMode);
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* The owner of the rollback journal or WAL file should always be the
    ** same as the owner of the database file.  Try to ensure that this is
    ** the case.  The chown() system call will be a no-op if the current
    ** process lacks root privileges, be we should at least try.  Without
    ** this step, if a root process opens a database file, it can leave
    ** behinds a journal/WAL that is owned by root and hence make the
    ** database inaccessible to unprivileged processes.
    **
    ** If openMode==0, then that means uid and gid are not set correctly
    ** (probably because SQLite is configured to use 8+3 filename mode) and
    ** in that case we do not want to attempt the chown().
    */
    if( openMode && (flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL))!=0 ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags =
                          flags & (SQLITE_OPEN_READONLY|SQLITE_OPEN_READWRITE);
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile
          ** and clear all the structure's references.  Specifically,
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif

  assert( zPath==0 || zPath[0]=='/'
      || eType==SQLITE_OPEN_SUPER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}